

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a1bcd::Handlers::endPagesArray(Handlers *this)

{
  __shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  QPDFJob::PagesConfig::endPages
            ((this->c_pages).super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->c_pages).super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>,
             &local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  return;
}

Assistant:

void
Handlers::endPagesArray()
{
    c_pages->endPages();
    c_pages = nullptr;
}